

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O1

bool nite::keyboardPressed(uint key)

{
  bool bVar1;
  bool bVar2;
  
  if (key < 0x65) {
    if (isKeysStatePressed[key] != false) {
      return true;
    }
    if (KeysStatePressed[key] == true) {
      if (KeysState[key] == false) {
        bVar2 = false;
        bVar1 = false;
LAB_00177b78:
        KeysStatePressed[key] = bVar2;
        return bVar1;
      }
    }
    else if (KeysState[key] == true) {
      isKeysStatePressed[key] = true;
      bVar2 = true;
      bVar1 = true;
      goto LAB_00177b78;
    }
  }
  return false;
}

Assistant:

bool nite::keyboardPressed(unsigned key){
	if (key >= niteKeysn){
		return 0;
	}

	if (isKeysStatePressed[key]){
		return 1;
	}

	if (KeysStatePressed[key] and KeysState[key]){
		return 0;
	}

	if (KeysStatePressed[key]){
		KeysStatePressed[key] = 0;
		return 0;
	}

	if (!KeysStatePressed[key] and KeysState[key]){
		isKeysStatePressed[key] = 1;
		KeysStatePressed[key] = 1;
		return 1;
	}

	return 0;
}